

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

char __thiscall RandomBotStrategy::yesOrNo(RandomBotStrategy *this,StrategyContext context)

{
  char cVar1;
  pointer __first;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  initializer_list<char> __l;
  vector<char,_std::allocator<char>_> optionVector;
  random_device local_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  local_13a0._M_x[0]._0_2_ = 0x6e79;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_13a0;
  std::vector<char,_std::allocator<char>_>::vector(&optionVector,__l,(allocator_type *)&local_2728);
  __first = optionVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_2728);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a0,(ulong)uVar2);
  std::
  shuffle<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)__first,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             optionVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_13a0);
  std::random_device::~random_device(&local_2728);
  if ((context < REINFORCE_CARD_COUNT) && ((0x441U >> (context & 0x1f) & 1) != 0)) {
    pcVar4 = " no, master";
    if (*optionVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start == 'y') {
      pcVar4 = " yes, master";
    }
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  cVar1 = *optionVector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&optionVector.super__Vector_base<char,_std::allocator<char>_>);
  return cVar1;
}

Assistant:

signed char RandomBotStrategy::yesOrNo(StrategyContext context) {
    std::vector<char> optionVector = {'y', 'n'};
    std::shuffle(optionVector.begin(), optionVector.end(), std::mt19937(std::random_device()())); // randomize the option vector
    switch((int) context) {
        case StrategyContext::ATTACK:
            std::cout << ((optionVector[0] == 'y') ? " yes, master" : " no, master") << std::endl;
            break;
        case StrategyContext::FORTIFY:
            std::cout << ((optionVector[0] == 'y') ? " yes, master" : " no, master") << std::endl;
            break;
        case StrategyContext::REINFORCE:
            std::cout << ((optionVector[0] == 'y') ? " yes, master" : " no, master") << std::endl;
            break;
    }
    return optionVector[0];
}